

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O0

RefCountedPtr<raptor::Status> __thiscall
raptor::MakeStatusFromFormat<char_const(&)[21],char_const*&>
          (raptor *this,char (*args) [21],char **args_1)

{
  char *local_28;
  char *message;
  char **args_local_1;
  char (*args_local) [21];
  RefCountedPtr<raptor::Status> *obj;
  
  local_28 = (char *)0x0;
  message = (char *)args_1;
  args_local_1 = (char **)args;
  args_local = (char (*) [21])this;
  raptor_asprintf(&local_28,*args,*args_1);
  if (local_28 == (char *)0x0) {
    RefCountedPtr<raptor::Status>::RefCountedPtr
              ((RefCountedPtr<raptor::Status> *)this,(nullptr_t)0x0);
  }
  else {
    MakeRefCounted<raptor::Status,char*&>(this,&local_28);
    Free(local_28);
  }
  return (RefCountedPtr<raptor::Status>)(Status *)this;
}

Assistant:

inline RefCountedPtr<Status> MakeStatusFromFormat(Args&&... args) {
    char* message = nullptr;
    raptor_asprintf(&message, std::forward<Args>(args)...);
    if (!message) {
        return nullptr;
    }
    RefCountedPtr<Status> obj = MakeRefCounted<Status>(message);
    raptor::Free(message);
    return obj;
}